

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::absolute_pose::modules::p3p_gao_main
               (bearingVectors_t *f,points_t *points,transformations_t *solutions)

{
  pointer *ppMVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pMVar6;
  iterator __position;
  double dVar7;
  undefined1 auVar8 [32];
  ulong uVar9;
  size_t i;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  double dVar46;
  undefined8 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  points_t p_cam;
  transformation_t solution;
  Matrix<double,_4,_1,_0,_4,_1> Z;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  vector<double,_std::allocator<double>_> x_temp;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_4,_1,_0,_4,_1> x;
  Matrix<double,_4,_1,_0,_4,_1> Y;
  Matrix<double,_4,_1,_0,_4,_1> tempXY;
  Matrix<double,_4,_1,_0,_4,_1> ones;
  Matrix<double,_4,_1,_0,_4,_1> tempXP3;
  Matrix<double,_4,_1,_0,_4,_1> tempXP2;
  points_t local_3a0;
  transformation_t local_380;
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined1 local_2b0 [16];
  ulong local_298;
  double local_290;
  ulong local_288;
  ulong local_280;
  double local_278;
  undefined1 local_270 [16];
  double local_260 [4];
  undefined8 local_240;
  vector<double,_std::allocator<double>_> local_238;
  undefined1 local_220 [16];
  double dStack_210;
  double dStack_208;
  double local_200;
  undefined8 *puStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double dStack_148;
  undefined1 local_140 [16];
  double local_130;
  double dStack_128;
  double local_120 [4];
  double local_100 [4];
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  undefined1 local_80 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auStack_2d0 = local_2e0._24_16_;
  pMVar6 = (f->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_130 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
  dStack_128 = *(double *)
                ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + 8);
  local_150 = pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  dStack_148 = *(double *)
                ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 8);
  local_170 = pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
  dStack_168 = *(double *)
                ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + 0x10);
  local_140._8_8_ = 0;
  local_140._0_8_ = dVar2;
  dVar34 = *(double *)
            ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  local_180._8_8_ = 0;
  local_180._0_8_ = dVar34;
  local_160 = *(double *)
               ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data + 0x10);
  dVar2 = dVar34 * dVar2 + local_170 * local_130 + local_170 * local_130;
  dVar2 = dVar2 + dVar2;
  auVar14 = vunpcklpd_avx(local_140,local_180);
  dVar46 = dVar2 * dVar2;
  dVar34 = local_160 * auVar14._0_8_ + local_150 * local_130 + local_150 * local_130;
  auVar22._0_8_ = dVar34 + dVar34;
  auVar22._8_8_ = dVar34 + dVar34;
  auVar23._0_8_ = auVar22._0_8_ * auVar22._0_8_;
  auVar23._8_8_ = auVar22._8_8_ * auVar22._8_8_;
  local_1c0 = vshufpd_avx(auVar22,auVar22,1);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  local_2b0 = vmulsd_avx512f(local_1c0,auVar21);
  local_190 = vshufpd_avx(auVar23,auVar23,1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar23._0_8_ + local_190._0_8_ + dVar46;
  auVar14 = vfnmadd231sd_avx512f(auVar14,local_2b0,auVar22);
  dVar34 = auVar14._0_8_ + -1.0;
  if ((dVar34 == 0.0) && (!NAN(dVar34))) {
    return;
  }
  pMVar6 = (points->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_220 = auVar22;
  auVar14 = *(undefined1 (*) [16])
             &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data;
  auVar15 = *(undefined1 (*) [16])
             &pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
  auVar16 = *(undefined1 (*) [16])
             &pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data;
  dVar34 = *(double *)
            ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 0x10);
  dVar56 = *(double *)
            ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  dVar3 = *(double *)
           ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data + 0x10);
  auVar24 = vsubpd_avx(auVar14,auVar15);
  auVar14 = vsubpd_avx(auVar14,auVar16);
  dVar7 = dVar34 - dVar56;
  dVar34 = dVar34 - dVar3;
  auVar15 = vsubpd_avx(auVar15,auVar16);
  dVar56 = dVar56 - dVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7 * dVar7 + auVar24._0_8_ * auVar24._0_8_ + auVar24._8_8_ * auVar24._8_8_;
  local_270 = vsqrtpd_avx(auVar19);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar34 * dVar34 + auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
  auVar14 = vsqrtpd_avx(auVar16);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar56 * dVar56 + auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar15 = vsqrtpd_avx(auVar24);
  auVar14 = vdivpd_avx(auVar14,local_270);
  auVar15 = vdivpd_avx(auVar15,local_270);
  local_1b0._0_8_ = auVar14._0_8_ * auVar14._0_8_;
  local_1b0._8_8_ = auVar14._8_8_ * auVar14._8_8_;
  auVar24 = ZEXT816(0xc000000000000000);
  local_1a0._0_8_ = auVar15._0_8_ * auVar15._0_8_;
  local_1a0._8_8_ = auVar15._8_8_ * auVar15._8_8_;
  local_1d0._0_8_ = local_1b0._0_8_ * local_1b0._0_8_;
  local_1d0._8_8_ = local_1b0._8_8_ * local_1b0._8_8_;
  auVar15 = vmulsd_avx512f(local_1a0,local_1a0);
  auVar16 = vaddsd_avx512f(local_1b0,local_1b0);
  auVar14 = vfmadd213sd_fma(auVar24,local_1b0,local_1d0);
  auVar14 = vaddsd_avx512f(auVar15,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_1b0._0_8_ * auVar23._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar14._0_8_ + 1.0;
  auVar14 = vfnmadd231sd_fma(auVar17,auVar18,local_1a0);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar16,local_1a0);
  auVar14 = vfmadd231sd_fma(auVar14,local_1a0,auVar24);
  local_260[0] = auVar14._0_8_;
  if ((local_260[0] == 0.0) && (!NAN(local_260[0]))) {
    return;
  }
  auVar17 = vaddsd_avx512f(auVar15,auVar15);
  auVar20._8_8_ = 0x8000000000000000;
  auVar20._0_8_ = 0x8000000000000000;
  local_1e0 = vxorpd_avx512vl(auVar18,auVar20);
  auVar18 = vmulsd_avx512f(local_1a0,ZEXT816(0x4010000000000000));
  auVar25._8_8_ = 0x8000000000000000;
  auVar25._0_8_ = 0x8000000000000000;
  auVar19 = vxorpd_avx512vl(local_1d0,auVar25);
  auVar26._8_8_ = 0x8000000000000000;
  auVar26._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(local_2b0,auVar26);
  local_320._0_16_ = auVar23;
  local_300._8_8_ = local_300._0_8_;
  local_300._0_8_ = dVar46;
  local_2f0._8_8_ = local_2f0._0_8_;
  local_2f0._0_8_ = dVar2;
  vmovsd_avx512f(auVar15);
  vmovsd_avx512f(auVar16);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       0.0;
  auVar14 = vmulsd_avx512f(auVar21,auVar17);
  vmovsd_avx512f(auVar17);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar2 * local_1b0._0_8_ * -2.0;
  auVar14 = vfmsub231sd_fma(auVar14,local_1a0,auVar48);
  dVar56 = local_1c0._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2 * local_1b0._0_8_ * auVar23._0_8_;
  auVar14 = vfmadd213sd_fma(auVar32,local_1a0,auVar14);
  vmovsd_avx512f(auVar18);
  dVar34 = dVar56 * local_1b0._0_8_ * auVar22._0_8_;
  auVar14 = vfmadd231sd_fma(auVar14,auVar21,auVar24);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar16,auVar21);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar2;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar18,auVar60);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_1b0._0_8_ * dVar56;
  auVar14 = vfmadd231sd_fma(auVar14,auVar49,auVar22);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar34;
  auVar14 = vfmadd231sd_fma(auVar14,auVar51,local_1a0);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar22._0_8_ * auVar19._0_8_;
  auVar14 = vfmadd231sd_fma(auVar14,auVar54,local_1c0);
  local_260[1] = auVar14._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar46;
  auVar14 = vfmadd213sd_fma(auVar23,local_1d0,auVar63);
  auVar14 = vfnmadd231sd_fma(auVar14,local_1b0,local_190);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_1b0._0_8_ * auVar20._0_8_;
  auVar14 = vfmadd213sd_fma(auVar28,auVar22,auVar14);
  auVar14 = vfmadd231sd_fma(auVar14,local_1d0,local_190);
  auVar14 = vfmadd231sd_fma(auVar14,local_1e0,local_1a0);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar14._0_8_ + 2.0;
  auVar14 = vfmadd231sd_fma(auVar29,local_1d0,auVar24);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar56 * local_1b0._0_8_ * local_1a0._0_8_ * auVar22._0_8_;
  auVar14 = vfnmadd213sd_fma(auVar55,auVar60,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar15,ZEXT816(0x4000000000000000));
  auVar14 = vfmadd231sd_fma(auVar14,local_1a0,ZEXT816(0xc010000000000000));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar46 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar30,local_1a0,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar63,auVar15);
  local_260[2] = auVar14._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_1a0._0_8_ * dVar34;
  auVar14 = vfmadd231sd_fma(auVar31,local_1c0,auVar54);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar17,auVar60);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_190._0_8_ * dVar2;
  auVar14 = vfmadd213sd_fma(auVar52,local_1b0,auVar14);
  auVar21 = vmulsd_avx512f(auVar16,auVar60);
  auVar14 = vfmadd213sd_fma(auVar21,local_1a0,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar18,auVar60);
  auVar14 = vfmadd231sd_fma(auVar14,auVar22,auVar49);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar16,auVar60);
  auVar22 = vfmadd231sd_fma(auVar14,auVar60,auVar24);
  auVar14 = vfmadd213sd_fma(auVar24,local_1a0,ZEXT816(0x3ff0000000000000));
  local_260[3] = auVar22._0_8_;
  auVar14 = vfmadd231sd_fma(auVar14,local_1b0,ZEXT816(0x4000000000000000));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_1d0._0_8_ + auVar14._0_8_;
  auVar14 = vfnmadd231sd_fma(auVar27,local_1b0,local_190);
  auVar14 = vaddsd_avx512f(auVar15,auVar14);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar16,local_1a0);
  local_240 = auVar14._0_8_;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       0.0;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       0.0;
  dStack_158 = local_160;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_380,5,5,1);
  if ((local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1] == 2.47032822920623e-323) &&
     (local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [2] == 4.94065645841247e-324)) {
    uVar13 = 5;
    uVar12 = 0;
    pdVar11 = (double *)
              local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array[0];
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_380,5,5,1);
    pdVar11 = (double *)
              local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array[0];
    uVar13 = (long)local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] *
             (long)local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[1];
    uVar12 = uVar13 + 7;
    if (-1 < (long)uVar13) {
      uVar12 = uVar13;
    }
    uVar12 = uVar12 & 0xfffffffffffffff8;
    if (7 < (long)uVar13) {
      uVar9 = 8;
      if (8 < (long)uVar12) {
        uVar9 = uVar12;
      }
      memcpy((void *)local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[0],local_260,uVar9 * 8);
    }
    if ((long)uVar13 <= (long)uVar12) goto LAB_00150d48;
  }
  memcpy(pdVar11 + uVar12,local_260 + uVar12,(uVar13 - uVar12) * 8);
LAB_00150d48:
  math::o4_roots(&local_238,(MatrixXd *)&local_380);
  if ((double *)
      local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [0] != (double *)0x0) {
    free(*(void **)((long)local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                          m_storage.m_data.array[0] + -8));
  }
  lVar10 = 0;
  do {
    local_120[lVar10] =
         local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_278;
  auVar64._8_8_ = 0x8000000000000000;
  auVar64._0_8_ = 0x8000000000000000;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       (double)local_e0;
  puStack_1f8 = &local_c0;
  auVar14 = vaddsd_avx512f(local_1a0,ZEXT816(0xbff0000000000000));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_2b0._0_8_;
  auVar22 = vmulsd_avx512f(local_220,auVar15);
  auVar21 = vaddsd_avx512f(local_1a0,local_1b0);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_2f0._0_8_;
  auVar23 = vmulsd_avx512f(local_1b0,auVar73);
  auVar15 = vmulsd_avx512f(local_190,local_220);
  auVar16 = vaddsd_avx512f(local_1a0,local_1a0);
  auVar24 = vaddsd_avx512f(local_1b0,auVar14);
  auVar35._0_8_ = auVar14._0_8_;
  auVar23 = vmulsd_avx512f(local_1a0,auVar23);
  auVar14 = vfmadd231sd_avx512f(auVar22,local_190,auVar24);
  auVar22 = vmulsd_avx512f(local_1a0,auVar73);
  auVar22 = vmulsd_avx512f(local_220,auVar22);
  dVar34 = local_1c0._0_8_;
  dVar2 = dVar34 + dVar34;
  auVar22 = vfnmadd213sd_fma(auVar22,local_1c0,auVar14);
  auVar24 = vmulsd_avx512f(local_220,local_320._0_16_);
  dVar46 = auVar24._0_8_;
  local_290 = dVar46 * local_290;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_278 * dVar34;
  auVar18 = vmulsd_avx512f(auVar57,local_320._0_16_);
  auVar17 = vmulsd_avx512f(local_320._0_16_,local_320._0_16_);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar2;
  auVar19 = vmulsd_avx512f(auVar61,local_320._0_16_);
  auVar20 = vaddsd_avx512f(auVar24,auVar24);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_288;
  auVar25 = vmulsd_avx512f(auVar71,auVar24);
  auVar14 = vfmadd213sd_fma(local_320._0_16_,local_1c0,auVar18);
  auVar19 = vmulsd_avx512f(local_1b0,auVar19);
  auVar26 = vmulsd_avx512f(local_1b0,auVar20);
  auVar27 = vxorpd_avx512vl(auVar20,auVar64);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_290;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_2f0._0_8_;
  auVar28 = vmulsd_avx512f(auVar74,auVar53);
  local_2b0._0_8_ = local_290;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar28,local_1a0);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar26,auVar74);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar20,auVar74);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar21._0_8_ * dVar2;
  auVar14 = vfnmadd213sd_avx512f(auVar67,local_320._0_16_,auVar14);
  dVar34 = auVar17._0_8_ * dVar34;
  auVar21 = vmulsd_avx512f(auVar74,auVar17);
  auVar17 = vmulsd_avx512f(local_1b0,auVar21);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar34;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar58,local_1b0);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_2f0._0_8_;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar25,auVar75);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = auVar23._0_8_ * dVar46;
  auVar14 = vfmadd213sd_avx512f(auVar69,local_320._0_16_,auVar14);
  auVar21 = vaddsd_avx512f(local_320._0_16_,local_320._0_16_);
  auVar21 = vmulsd_avx512f(local_1c0,auVar21);
  auVar23 = vmulsd_avx512f(local_1d0,local_320._0_16_);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_278 * auVar27._0_8_;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar68,auVar75);
  auVar27 = vmulsd_avx512f(local_1b0,auVar21);
  auVar29 = vmulsd_avx512f(auVar50,auVar21);
  auVar14 = vfmadd213sd_avx512f(auVar27,local_1a0,auVar14);
  auVar21 = vmulsd_avx512f(local_320._0_16_,auVar24);
  auVar14 = vfmadd213sd_avx512f(auVar23,local_1c0,auVar14);
  auVar23 = vmulsd_avx512f(auVar24,auVar16);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = auVar21._0_8_ * local_1d0._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_300._0_8_;
  auVar27 = vfmadd231sd_avx512f(auVar70,auVar24,auVar77);
  auVar21 = vfnmadd231sd_fma(auVar14,auVar58,local_1d0);
  auVar14 = vfmadd231sd_avx512f(auVar27,auVar15,local_1d0);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar24,auVar71);
  auVar27 = vmulsd_avx512f(local_1d0,ZEXT816(0xc000000000000000));
  auVar14 = vfnmadd213sd_avx512f(auVar23,auVar77,auVar14);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_300._0_8_;
  auVar23 = vmulsd_avx512f(auVar78,auVar24);
  auVar14 = vfmadd213sd_avx512f(auVar23,auVar50,auVar14);
  auVar23 = vmulsd_avx512f(local_1c0,ZEXT816(0x4010000000000000));
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_280;
  auVar14 = vfmadd213sd_avx512f(auVar72,auVar24,auVar14);
  auVar30 = vaddsd_avx512f(local_190,local_190);
  auVar65._0_8_ = -auVar30._0_8_;
  auVar65._8_8_ = auVar30._8_8_ ^ 0x8000000000000000;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar27,auVar24);
  auVar31 = vmulsd_avx512f(local_1b0,auVar65);
  auVar23 = vmulsd_avx512f(local_1a0,auVar23);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar31,local_220);
  auVar32 = vmulsd_avx512f(auVar23,local_320._0_16_);
  auVar14 = vfmadd213sd_avx512f(auVar32,auVar75,auVar14);
  auVar32 = vmulsd_avx512f(auVar16,local_190);
  auVar32 = vmulsd_avx512f(auVar32,local_220);
  auVar14 = vfmadd213sd_avx512f(auVar32,local_1b0,auVar14);
  auVar32 = vmulsd_avx512f(local_320._0_16_,auVar16);
  auVar32 = vmulsd_avx512f(auVar75,auVar32);
  auVar32 = vmulsd_avx512f(local_1b0,auVar32);
  auVar14 = vfnmadd213sd_avx512f(auVar32,local_1c0,auVar14);
  auVar32 = vmulsd_avx512f(local_1a0,auVar30);
  auVar14 = vfnmadd213sd_avx512f(auVar32,local_220,auVar14);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_1e0._0_8_;
  auVar32 = vmulsd_avx512f(auVar24,auVar4);
  auVar14 = vfmadd231sd_avx512f(auVar14,local_220,local_190);
  auVar14 = vfmadd231sd_avx512f(auVar14,local_1a0,auVar32);
  auVar14 = vfmadd213sd_avx512f(auVar19,auVar75,auVar14);
  auVar19 = vmulsd_avx512f(local_1c0,auVar30);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar50,auVar15);
  auVar15 = vmulsd_avx512f(auVar75,auVar61);
  auVar14 = vfnmadd213sd_avx512f(auVar15,local_320._0_16_,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar24,ZEXT816(0x4000000000000000));
  auVar14 = vfnmadd213sd_avx512f(auVar29,auVar75,auVar14);
  auVar15 = vmulsd_avx512f(local_1b0,auVar19);
  auVar17 = vfnmadd213sd_avx512f(auVar17,local_1c0,auVar14);
  auVar14 = vmulsd_avx512f(local_1c0,local_320._0_16_);
  auVar14 = vmulsd_avx512f(auVar78,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar75,auVar25);
  auVar14 = vfmadd213sd_avx512f(auVar15,local_1a0,auVar14);
  auVar15 = vmulsd_avx512f(auVar27,local_320._0_16_);
  auVar14 = vfnmadd231sd_avx512f(auVar14,local_320._0_16_,auVar23);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_2f0._0_8_;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar76,auVar26);
  auVar23 = vmulsd_avx512f(auVar76,auVar30);
  auVar14 = vfnmadd213sd_avx512f(auVar23,local_220,auVar14);
  auVar14 = vfmadd213sd_avx512f(auVar15,local_1c0,auVar14);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar34;
  auVar14 = vfmadd231sd_avx512f(auVar14,local_1b0,auVar59);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar2 * local_278;
  auVar14 = vfmadd213sd_avx512f(auVar66,local_320._0_16_,auVar14);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar76,auVar68);
  auVar23 = vmulsd_avx512f(local_1c0,local_190);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar19,local_1a0);
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar50);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar61,local_320._0_16_);
  auVar14 = vfmadd231sd_avx512f(auVar14,local_190,local_1c0);
  auVar35._8_8_ = 0;
  auVar14 = vfmadd231sd_avx512f(auVar14,local_1a0,auVar28);
  auVar15 = vaddsd_avx512f(auVar76,auVar76);
  auVar15 = vmulsd_avx512f(local_190,auVar15);
  auVar25 = vsubsd_avx512f(auVar35,local_1b0);
  auVar15 = vmulsd_avx512f(local_1b0,auVar15);
  auVar22 = vfmadd213sd_avx512f(auVar25,local_320._0_16_,auVar22);
  auVar25 = vmulsd_avx512f(local_1a0,auVar61);
  auVar14 = vfmadd213sd_avx512f(auVar15,local_220,auVar14);
  auVar15 = vmulsd_avx512f(auVar76,ZEXT816(0x4010000000000000));
  auVar25 = vmulsd_avx512f(auVar25,local_320._0_16_);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = auVar30._0_8_ * local_278;
  auVar26 = vmulsd_avx512f(auVar62,local_220);
  auVar15 = vmulsd_avx512f(local_1a0,auVar15);
  auVar15 = vmulsd_avx512f(local_220,auVar15);
  auVar14 = vfmadd213sd_avx512f(auVar15,local_190,auVar14);
  auVar14 = vfnmadd213sd_avx512f(auVar25,auVar78,auVar14);
  auVar14 = vfnmadd213sd_avx512f(auVar26,auVar76,auVar14);
  auVar15 = vmulsd_avx512f(local_1b0,auVar22);
  dVar2 = auVar22._0_8_ * auVar15._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_290;
  auVar22 = vmulsd_avx512f(local_1a0,auVar5);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar18,auVar78);
  auVar15 = vfmsub231sd_avx512f(auVar76,local_1a0,auVar76);
  auVar36._8_8_ = dVar2;
  auVar36._0_8_ = dVar2;
  auVar36._16_8_ = dVar2;
  auVar36._24_8_ = dVar2;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar76,auVar20);
  dVar56 = auVar15._0_8_;
  auVar15 = vfnmadd231sd_avx512f(auVar14,local_1b0,auVar19);
  auVar14 = vfmadd231sd_fma(auVar22,auVar50,auVar24);
  auVar22 = vfmadd231sd_fma(auVar15,local_1d0,auVar23);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar32,local_1a0);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar16,auVar24);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar46 + auVar14._0_8_;
  auVar14 = vfmadd231sd_fma(auVar43,local_1d0,auVar24);
  auVar23 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),local_1a0);
  auVar15 = vsubsd_avx512f(auVar23,local_1b0);
  auVar23 = vaddsd_avx512f(local_1b0,auVar23);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar20,local_1b0);
  uVar47 = auVar15._0_8_;
  local_80._0_8_ = local_120[0] * local_120[0];
  local_80._8_8_ = local_120[1] * local_120[1];
  local_80._16_8_ = local_120[2] * local_120[2];
  local_80._24_8_ = local_120[3] * local_120[3];
  local_a0 = local_120[0] * local_80._0_8_;
  dStack_98 = local_120[1] * local_80._8_8_;
  dStack_90 = local_120[2] * local_80._16_8_;
  dStack_88 = local_120[3] * local_80._24_8_;
  auVar33._8_8_ = uVar47;
  auVar33._0_8_ = uVar47;
  auVar33._16_8_ = uVar47;
  auVar33._24_8_ = uVar47;
  auVar33 = vmulpd_avx512vl(local_80,auVar33);
  auVar15 = vmulsd_avx512f(auVar31,local_220);
  local_c0 = 0x3ff0000000000000;
  uStack_b8 = 0x3ff0000000000000;
  uStack_b0 = 0x3ff0000000000000;
  uStack_a8 = 0x3ff0000000000000;
  auVar15 = vmulsd_avx512f(auVar76,auVar15);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       auVar14._0_8_;
  dVar34 = auVar21._0_8_;
  auVar14 = vfmadd213sd_avx512f(auVar15,local_1a0,auVar22);
  local_200 = auVar14._0_8_;
  local_2e0._0_8_ = auVar17._0_8_;
  local_2e0._8_8_ = local_120;
  dVar2 = auVar23._0_8_ * 1.0;
  vmovsd_avx512f(local_220);
  auVar44._0_8_ =
       (auVar33._0_8_ + dVar56 * local_120[0] + dVar2) *
       (local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] * local_a0 + dVar34 * local_80._0_8_ + (double)local_2e0._0_8_ * local_120[0] +
       local_200 * 1.0);
  auVar44._8_8_ =
       (auVar33._8_8_ + dVar56 * local_120[1] + dVar2) *
       (local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] * dStack_98 + dVar34 * local_80._8_8_ + (double)local_2e0._0_8_ * local_120[1] +
       local_200 * 1.0);
  auVar44._16_8_ =
       (auVar33._16_8_ + dVar56 * local_120[2] + dVar2) *
       (local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] * dStack_90 + dVar34 * local_80._16_8_ + (double)local_2e0._0_8_ * local_120[2] +
       local_200 * 1.0);
  auVar44._24_8_ =
       (auVar33._24_8_ + dVar56 * local_120[3] + dVar2) *
       (local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] * dStack_88 + dVar34 * local_80._24_8_ + (double)local_2e0._0_8_ * local_120[3] +
       local_200 * 1.0);
  _local_220 = vdivpd_avx(auVar44,auVar36);
  dVar2 = local_220._0_8_;
  dVar34 = local_220._8_8_;
  dVar46 = local_220._16_8_;
  dVar56 = local_220._24_8_;
  local_e0._0_8_ = dVar2 * local_120[0];
  local_e0._8_8_ = dVar34 * local_120[1];
  local_e0._16_8_ = dVar46 * local_120[2];
  local_e0._24_8_ = dVar56 * local_120[3];
  auVar37._0_8_ = dVar2 * dVar2 + local_80._0_8_;
  auVar37._8_8_ = dVar34 * dVar34 + local_80._8_8_;
  auVar37._16_8_ = dVar46 * dVar46 + local_80._16_8_;
  auVar37._24_8_ = dVar56 * dVar56 + local_80._24_8_;
  auVar8._8_8_ = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0];
  auVar8._0_8_ = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0];
  auVar8._16_8_ =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  auVar8._24_8_ =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  auVar33 = vmulpd_avx512vl(local_e0,auVar8);
  local_320 = vsubpd_avx(auVar37,auVar33);
  local_298 = auVar35._0_8_;
  if (local_320._0_8_ < 0.0) {
    auVar39._0_8_ = sqrt(local_320._0_8_);
    auVar39._8_56_ = extraout_var;
    local_2f0 = auVar39._0_16_;
  }
  else {
    local_2f0 = vsqrtsd_avx(local_320._0_16_,local_320._0_16_);
  }
  auVar14 = vshufpd_avx(local_320._0_16_,local_320._0_16_,1);
  if (auVar14._0_8_ < 0.0) {
    auVar40._0_8_ = sqrt(auVar14._0_8_);
    auVar40._8_56_ = extraout_var_00;
    local_300 = auVar40._0_16_;
    auVar14 = local_320._16_16_;
  }
  else {
    local_300 = vsqrtsd_avx(auVar14,auVar14);
    auVar14 = local_320._16_16_;
  }
  if (auVar14._0_8_ < 0.0) {
    local_320._0_16_ = auVar14;
    auVar41._0_8_ = sqrt(auVar14._0_8_);
    auVar41._8_56_ = extraout_var_01;
    auVar22 = auVar41._0_16_;
    auVar14 = local_320._0_16_;
  }
  else {
    auVar22 = vsqrtsd_avx(auVar14,auVar14);
  }
  auVar14 = vshufpd_avx(auVar14,auVar14,1);
  if (auVar14._0_8_ < 0.0) {
    local_320._0_16_ = auVar22;
    auVar42._0_8_ = sqrt(auVar14._0_8_);
    auVar42._8_56_ = extraout_var_02;
    auVar14 = auVar42._0_16_;
    auVar22 = local_320._0_16_;
  }
  else {
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
  }
  auVar14 = vunpcklpd_avx(auVar22,auVar14);
  lVar10 = 0;
  auVar22 = vunpcklpd_avx(local_2f0,local_300);
  auVar45._8_8_ = local_270._0_8_;
  auVar45._0_8_ = local_270._0_8_;
  auVar45._16_8_ = local_270._0_8_;
  auVar45._24_8_ = local_270._0_8_;
  auVar38._16_16_ = auVar14;
  auVar38._0_16_ = auVar22;
  _local_2e0 = vdivpd_avx(auVar45,auVar38);
  local_200 = local_2e0._0_8_ * local_120[0];
  puStack_1f8 = (undefined8 *)(local_2e0._8_8_ * local_120[1]);
  dStack_1f0 = local_2e0._16_8_ * local_120[2];
  dStack_1e8 = local_2e0._24_8_ * local_120[3];
  local_100[0] = local_2e0._0_8_ * (double)local_220._0_8_;
  local_100[1] = local_2e0._8_8_ * (double)local_220._8_8_;
  local_100[2] = local_2e0._16_8_ * dStack_210;
  local_100[3] = local_2e0._24_8_ * dStack_208;
  do {
    local_3a0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    local_3a0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = (&local_200)[lVar10];
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * local_130;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * dStack_128;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * (double)local_140._0_8_;
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_3a0,(iterator)0x0,(Matrix<double,_3,_1,_0,_3,_1> *)&local_380);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_100[lVar10];
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * local_150;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * dStack_148;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * local_160;
    if (local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_3a0,
                 (iterator)
                 local_3a0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_380);
    }
    else {
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      local_3a0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_3a0.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = *(double *)(local_2e0 + lVar10 * 8);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * local_170;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * dStack_168;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2] * (double)local_180._0_8_;
    if (local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_3a0,
                 (iterator)
                 local_3a0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_380);
    }
    else {
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      local_3a0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_3a0.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    math::arun_complete(&local_380,points,&local_3a0);
    __position._M_current =
         (solutions->
         super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (solutions->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                  *)solutions,__position,&local_380);
    }
    else {
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[4] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[5] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[6] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[7] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[8] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[9] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[9];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[10] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[0xb] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0xb];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[0] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[1] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[2] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[3] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[4] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[5] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[6] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[7] =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
      ppMVar1 = &(solutions->
                 super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    if (local_3a0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free((void *)local_3a0.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2]);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_gao_main(
    const bearingVectors_t & f,
    const points_t & points,
    transformations_t & solutions )
{
  point_t A = points[0];
  point_t B = points[1];
  point_t C = points[2];

  Eigen::Vector3d tempp;
  tempp = A-B;
  double AB = tempp.norm();
  tempp = B-C;
  double BC = tempp.norm();
  tempp = A-C;
  double AC = tempp.norm();

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  double cosalpha = f2.transpose()*f3;
  double cosbeta = f1.transpose()*f3;
  double cosgamma = f1.transpose()*f2;

  double a=pow((BC/AB),2);
  double b=pow((AC/AB),2);
  double p=2*cosalpha;
  double q=2*cosbeta;
  double r=2*cosgamma;

  double aSq = a * a;
  double bSq = b * b;
  double pSq = p*p;
  double qSq = q*q;
  double rSq = r*r;

  if ((pSq + qSq + rSq - p*q*r - 1) == 0)
    return;

  Eigen::Matrix<double,5,1> factors;

  factors[0] = -2*b + bSq + aSq + 1 - b*rSq*a + 2*b*a - 2*a;

  if (factors[0] == 0)
    return;

  factors[1] =
      -2*b*q*a - 2*aSq*q + b*rSq*q*a - 2*q + 2*b*q +
      4*a*q + p*b*r + b*r*p*a - bSq*r*p;
  factors[2] =
      qSq + bSq*rSq - b*pSq - q*p*b*r + bSq*pSq - b*rSq*a +
      2 - 2*bSq - a*b*r*p*q + 2*aSq - 4*a - 2*qSq*a + qSq*aSq;
  factors[3] =
      -bSq*r*p + b*r*p*a - 2*aSq*q + q*pSq*b +
      2*b*q*a + 4*a*q + p*b*r - 2*b*q - 2*q;
  factors[4] = 1 - 2*a + 2*b + bSq - b*pSq + aSq - 2*b*a;

  std::vector<double> x_temp = math::o4_roots(factors);
  Eigen::Matrix<double,4,1> x;
  for( size_t i = 0; i < 4; i++ ) x[i] = x_temp[i];

  double temp = (pSq*(a-1+b) + p*q*r - q*a*r*p + (a-1-b)*rSq);
  double b0 = b * temp * temp;

  double rCb = rSq*r;

  Eigen::Matrix<double,4,1> tempXP2;
  tempXP2[0] = x[0]*x[0];
  tempXP2[1] = x[1]*x[1];
  tempXP2[2] = x[2]*x[2];
  tempXP2[3] = x[3]*x[3];
  Eigen::Matrix<double,4,1> tempXP3;
  tempXP3[0] = tempXP2[0]*x[0];
  tempXP3[1] = tempXP2[1]*x[1];
  tempXP3[2] = tempXP2[2]*x[2];
  tempXP3[3] = tempXP2[3]*x[3];

  Eigen::Matrix<double,4,1> ones;
  for( size_t i = 0; i < 4; i++) ones[i] = 1.0;

  Eigen::Matrix<double,4,1> b1_part1 =
      (1-a-b)*tempXP2 + (q*a-q)*x + (1 - a + b)*ones;

  Eigen::Matrix<double,4,1> b1_part2 =
      (aSq*rCb + 2*b*rCb*a - b*rSq*rCb*a - 2*a*rCb + rCb + bSq*rCb
      - 2*rCb*b)*tempXP3
      +(p*rSq + p*aSq*rSq - 2*b*rCb*q*a + 2*rCb*b*q - 2*rCb*q - 2*p*(a+b)*rSq
      + rSq*rSq*p*b + 4*a*rCb*q + b*q*a*rCb*rSq - 2*rCb*aSq*q +2*rSq*p*b*a
      + bSq*rSq*p - rSq*rSq*p*bSq)*tempXP2
      +(rCb*qSq + rSq*rCb*bSq + r*pSq*bSq - 4*a*rCb - 2*a*rCb*qSq + rCb*qSq*aSq
      + 2*aSq*rCb - 2*bSq*rCb - 2*pSq*b*r + 4*p*a*rSq*q + 2*a*pSq*r*b
      - 2*a*rSq*q*b*p - 2*pSq*a*r + r*pSq - b*rSq*rCb*a + 2*p*rSq*b*q
      + r*pSq*aSq -2*p*q*rSq + 2*rCb - 2*rSq*p*aSq*q - rSq*rSq*q*b*p)*x
      +(4*a*rCb*q + p*rSq*qSq + 2*pSq*p*b*a - 4*p*a*rSq - 2*rCb*b*q - 2*pSq*q*r
      - 2*bSq*rSq*p + rSq*rSq*p*b + 2*p*aSq*rSq - 2*rCb*aSq*q - 2*pSq*p*a
      + pSq*p*aSq + 2*p*rSq + pSq*p + 2*b*rCb*q*a + 2*q*pSq*b*r + 4*q*a*r*pSq
      - 2*p*a*rSq*qSq - 2*pSq*aSq*r*q + p*aSq*rSq*qSq - 2*rCb*q - 2*pSq*p*b
      + pSq*p*bSq - 2*pSq*b*r*q*a)*ones;

  Eigen::Matrix<double,4,1> b1;
  b1[0] = b1_part1[0]*b1_part2[0];
  b1[1] = b1_part1[1]*b1_part2[1];
  b1[2] = b1_part1[2]*b1_part2[2];
  b1[3] = b1_part1[3]*b1_part2[3];

  Eigen::Matrix<double,4,1> y=b1/b0;
  Eigen::Matrix<double,4,1> tempYP2;
  tempYP2[0] = pow(y[0],2);
  tempYP2[1] = pow(y[1],2);
  tempYP2[2] = pow(y[2],2);
  tempYP2[3] = pow(y[3],2);

  Eigen::Matrix<double,4,1> tempXY;
  tempXY[0] = x[0]*y[0];
  tempXY[1] = x[1]*y[1];
  tempXY[2] = x[2]*y[2];
  tempXY[3] = x[3]*y[3];

  Eigen::Matrix<double,4,1> v= tempXP2 + tempYP2 - r*tempXY;

  Eigen::Matrix<double,4,1> Z;
  Z[0] = AB/sqrt(v[0]);
  Z[1] = AB/sqrt(v[1]);
  Z[2] = AB/sqrt(v[2]);
  Z[3] = AB/sqrt(v[3]);

  Eigen::Matrix<double,4,1> X;
  X[0] = x[0]*Z[0];
  X[1] = x[1]*Z[1];
  X[2] = x[2]*Z[2];
  X[3] = x[3]*Z[3];

  Eigen::Matrix<double,4,1> Y;
  Y[0] = y[0]*Z[0];
  Y[1] = y[1]*Z[1];
  Y[2] = y[2]*Z[2];
  Y[3] = y[3]*Z[3];

  for( int i = 0; i < 4; i++ )
  {
    //apply arun to find the transformation
    points_t p_cam;
    p_cam.push_back(X[i]*f1);
    p_cam.push_back(Y[i]*f2);
    p_cam.push_back(Z[i]*f3);

    transformation_t solution = math::arun_complete(points,p_cam);
    solutions.push_back(solution);
  }
}